

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b38497::Target::AddBacktrace(Target *this,Value *object,cmListFileBacktrace *bt)

{
  bool bVar1;
  Value *this_00;
  Value local_50;
  UInt local_24;
  cmListFileBacktrace *pcStack_20;
  ArrayIndex backtrace;
  cmListFileBacktrace *bt_local;
  Value *object_local;
  Target *this_local;
  
  pcStack_20 = bt;
  bt_local = (cmListFileBacktrace *)object;
  object_local = (Value *)this;
  bVar1 = BacktraceData::Add(&this->Backtraces,bt,&local_24);
  if (bVar1) {
    Json::Value::Value(&local_50,local_24);
    this_00 = Json::Value::operator[]((Value *)bt_local,"backtrace");
    Json::Value::operator=(this_00,&local_50);
    Json::Value::~Value(&local_50);
  }
  return;
}

Assistant:

void Target::AddBacktrace(Json::Value& object, cmListFileBacktrace const& bt)
{
  Json::ArrayIndex backtrace;
  if (this->Backtraces.Add(bt, backtrace)) {
    object["backtrace"] = backtrace;
  }
}